

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void Js::DynamicProfileInfo::GetSourceAndFunctionId
               (FunctionBody *functionBody,FunctionInfo *calleeFunctionInfo,
               JavascriptFunction *calleeFunction,SourceId *sourceId,LocalFunctionId *functionId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  LocalFunctionId LVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  ScriptContext *pSVar7;
  FunctionProxy *this;
  DWORD_PTR DVar8;
  DWORD_PTR DVar9;
  FunctionProxy *calleeFunctionProxy;
  LocalFunctionId *functionId_local;
  SourceId *sourceId_local;
  JavascriptFunction *calleeFunction_local;
  FunctionInfo *calleeFunctionInfo_local;
  FunctionBody *functionBody_local;
  
  if ((sourceId == (SourceId *)0x0) || (functionId == (LocalFunctionId *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x281,"(sourceId != nullptr && functionId != nullptr)",
                                "sourceId != nullptr && functionId != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  *sourceId = 0xfffffffc;
  if (calleeFunction == (JavascriptFunction *)0x0) {
    *functionId = 0xfffffffd;
  }
  else {
    BVar3 = FunctionInfo::HasBody(calleeFunctionInfo);
    if (BVar3 == 0) {
      pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)calleeFunction);
      if (pSVar6 == pSVar7) {
        *sourceId = 0xfffffffe;
        LVar4 = FunctionInfo::GetLocalFunctionId(calleeFunctionInfo);
        *functionId = LVar4;
      }
      else {
        *functionId = 0xfffffffe;
      }
    }
    else {
      this = FunctionInfo::GetFunctionProxy(calleeFunctionInfo);
      pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      pSVar7 = FunctionProxy::GetScriptContext(this);
      if (pSVar6 == pSVar7) {
        DVar8 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)functionBody);
        DVar9 = FunctionProxy::GetSecondaryHostSourceContext(this);
        if (DVar8 == DVar9) {
          DVar8 = FunctionProxy::GetHostSourceContext((FunctionProxy *)functionBody);
          DVar9 = FunctionProxy::GetHostSourceContext(this);
          if (DVar8 == DVar9) {
            *sourceId = 0xfffffffd;
          }
          else {
            DVar8 = FunctionProxy::GetHostSourceContext(this);
            *sourceId = (SourceId)DVar8;
          }
          LVar4 = FunctionProxy::GetLocalFunctionId(this);
          *functionId = LVar4;
        }
        else {
          DVar8 = FunctionProxy::GetHostSourceContext(this);
          if (DVar8 == 0xfffffffffffffffe) {
            *sourceId = 0xfffffffb;
            LVar4 = FunctionProxy::GetLocalFunctionId(this);
            *functionId = LVar4;
          }
          else {
            *functionId = 0xfffffffe;
          }
        }
      }
      else {
        *functionId = 0xfffffffe;
      }
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::GetSourceAndFunctionId(FunctionBody * functionBody, FunctionInfo* calleeFunctionInfo, JavascriptFunction * calleeFunction, Js::SourceId * sourceId, Js::LocalFunctionId * functionId)
    {
        Assert(sourceId != nullptr && functionId != nullptr);

        *sourceId = InvalidSourceId;

        if (calleeFunction == nullptr)
        {
            *functionId = CallSiteNonFunction;
            return;
        }

        if (!calleeFunctionInfo->HasBody())
        {
            if (functionBody->GetScriptContext() == calleeFunction->GetScriptContext())
            {
                *sourceId = BuiltInSourceId;
                *functionId = calleeFunctionInfo->GetLocalFunctionId();
            }
            else
            {
                *functionId = CallSiteCrossContext;
            }
            return;
        }

        // We can only inline function that are from the same script context. So only record that data
        // We're about to call this function so deserialize it right now
        FunctionProxy * calleeFunctionProxy = calleeFunctionInfo->GetFunctionProxy();
        if (functionBody->GetScriptContext() == calleeFunctionProxy->GetScriptContext())
        {
            if (functionBody->GetSecondaryHostSourceContext() == calleeFunctionProxy->GetSecondaryHostSourceContext())
            {
                if (functionBody->GetHostSourceContext() == calleeFunctionProxy->GetHostSourceContext())
                {
                    *sourceId = CurrentSourceId; // Caller and callee in same file
                }
                else
                {
                    *sourceId = (Js::SourceId)calleeFunctionProxy->GetHostSourceContext(); // Caller and callee in different files
                }
                *functionId = calleeFunctionProxy->GetLocalFunctionId();
            }
            else if (calleeFunctionProxy->GetHostSourceContext() == Js::Constants::JsBuiltInSourceContext)
            {
                *sourceId = JsBuiltInSourceId;
                *functionId = calleeFunctionProxy->GetLocalFunctionId();
            }
            else
            {
                // Pretend that we are cross context when call is crossing script file.
                *functionId = CallSiteCrossContext;
            }
        }
        else
        {
            *functionId = CallSiteCrossContext;
        }
    }